

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::skipMacroTokensBeforeProtectRegion
          (Preprocessor *this,Token directive,SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  size_type sVar1;
  Diagnostic *this_00;
  Token *args;
  SourceRange SVar2;
  Token local_28;
  
  local_28.info = directive.info;
  local_28._0_8_ = directive._0_8_;
  if (this->currentMacroToken != (Token *)0x0) {
    SVar2 = Token::range(this->currentMacroToken);
    this_00 = addDiag(this,(DiagCode)0x110004,SVar2);
    SVar2 = Token::range(&local_28);
    Diagnostic::addNote(this_00,(DiagCode)0x1c0004,SVar2);
    args = this->currentMacroToken;
    do {
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (skippedTokens,args);
      sVar1 = (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len;
      args = this->currentMacroToken + 1;
      this->currentMacroToken = args;
    } while (args != (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_ +
                     sVar1);
    this->currentMacroToken = (Token *)0x0;
    (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  }
  return;
}

Assistant:

void Preprocessor::skipMacroTokensBeforeProtectRegion(Token directive,
                                                      SmallVectorBase<Token>& skippedTokens) {
    // We're about to lex an encoded / encrypted data block based on a pragma
    // protect directive, so we don't expect there to be macro tokens still pending.
    // If there are, issue an error and skip them.
    SLANG_ASSERT(!currentToken);
    if (currentMacroToken) {
        addDiag(diag::MacroTokensAfterPragmaProtect, currentMacroToken->range())
            .addNote(diag::NoteDirectiveHere, directive.range());

        do {
            skippedTokens.push_back(*currentMacroToken);
            currentMacroToken++;
        } while (currentMacroToken != expandedTokens.end());

        currentMacroToken = nullptr;
        expandedTokens.clear();
    }
}